

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

DynamicTypeHandler * __thiscall
Js::SimpleTypeHandler<1UL>::Clone(SimpleTypeHandler<1UL> *this,Recycler *recycler)

{
  Recycler *alloc;
  SimpleTypeHandler<1UL> *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&SimpleTypeHandler<1ul>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ddc672;
  data.filename._0_4_ = 0x4f;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_40);
  this_00 = (SimpleTypeHandler<1UL> *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  SimpleTypeHandler(this_00,this);
  return &this_00->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler * SimpleTypeHandler<size>::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, SimpleTypeHandler<size>, this);
    }